

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sph.cpp
# Opt level: O3

KHType __thiscall
Pearson8x8::operator()
          (Pearson8x8 *this,string *keyword,
          vector<unsigned_char,_std::allocator<unsigned_char>_> *mixTable,size_t pkSize)

{
  uchar *__args_1;
  byte bVar1;
  function<unsigned_char_(const_char_*,_const_unsigned_char_*,_unsigned_long)> local_30;
  
  local_30.super__Function_base._M_functor._8_8_ = 0;
  local_30.super__Function_base._M_functor._M_unused._M_object = hash;
  local_30._M_invoker =
       std::
       _Function_handler<unsigned_char_(const_char_*,_const_unsigned_char_*,_unsigned_long),_unsigned_char_(*)(const_char_*,_const_unsigned_char_*,_unsigned_long)>
       ::_M_invoke;
  local_30.super__Function_base._M_manager =
       std::
       _Function_handler<unsigned_char_(const_char_*,_const_unsigned_char_*,_unsigned_long),_unsigned_char_(*)(const_char_*,_const_unsigned_char_*,_unsigned_long)>
       ::_M_manager;
  __args_1 = (mixTable->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
             super__Vector_impl_data._M_start;
  bVar1 = std::function<unsigned_char_(const_char_*,_const_unsigned_char_*,_unsigned_long)>::
          operator()(&local_30,(keyword->_M_dataplus)._M_p,__args_1,
                     (long)(mixTable->
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                           _M_impl.super__Vector_impl_data._M_finish - (long)__args_1);
  if (local_30.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_30.super__Function_base._M_manager)
              ((_Any_data *)&local_30,(_Any_data *)&local_30,__destroy_functor);
  }
  return (KHType)((ushort)bVar1 << 8 | (ushort)((ulong)bVar1 % pkSize));
}

Assistant:

KHType operator()(const string & keyword, const vector<Key> & mixTable, const size_t pkSize)
    {
        return HashInfix<Key, Hash>(keyword, mixTable, pkSize, hash);
    }